

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<FunctionDef>::copyAppend
          (QGenericArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  qsizetype *pqVar1;
  FunctionDef *pFVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  FunctionDef *pFVar6;
  TypeTags TVar7;
  Token TVar8;
  ReferenceType RVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  bool bVar18;
  
  if ((b != e) && (b < e)) {
    pFVar2 = (this->super_QArrayDataPointer<FunctionDef>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<FunctionDef>).size;
      pDVar4 = (b->type).name.d.d;
      pFVar2[lVar3].type.name.d.d = pDVar4;
      pFVar2[lVar3].type.name.d.ptr = (b->type).name.d.ptr;
      pFVar2[lVar3].type.name.d.size = (b->type).name.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar4 = (b->type).rawName.d.d;
      pFVar2[lVar3].type.rawName.d.d = pDVar4;
      pFVar2[lVar3].type.rawName.d.ptr = (b->type).rawName.d.ptr;
      pFVar2[lVar3].type.rawName.d.size = (b->type).rawName.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      TVar7.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
           (b->type).typeTag.super_QFlagsStorageHelper<TypeTag,_4>;
      TVar8 = (b->type).firstToken;
      RVar9 = (b->type).referenceType;
      *(undefined4 *)&pFVar2[lVar3].type.field_0x30 = *(undefined4 *)&(b->type).field_0x30;
      pFVar2[lVar3].type.typeTag =
           (TypeTags)TVar7.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i;
      pFVar2[lVar3].type.firstToken = TVar8;
      pFVar2[lVar3].type.referenceType = RVar9;
      pDVar5 = (b->arguments).d.d;
      pFVar2[lVar3].arguments.d.d = pDVar5;
      pFVar2[lVar3].arguments.d.ptr = (b->arguments).d.ptr;
      pFVar2[lVar3].arguments.d.size = (b->arguments).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->normalizedType).d.d;
      pFVar2[lVar3].normalizedType.d.d = pDVar4;
      pFVar2[lVar3].normalizedType.d.ptr = (b->normalizedType).d.ptr;
      pFVar2[lVar3].normalizedType.d.size = (b->normalizedType).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->tag).d.d;
      pFVar2[lVar3].tag.d.d = pDVar4;
      pFVar2[lVar3].tag.d.ptr = (b->tag).d.ptr;
      pFVar2[lVar3].tag.d.size = (b->tag).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->name).d.d;
      pFVar2[lVar3].name.d.d = pDVar4;
      pFVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pFVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->inPrivateClass).d.d;
      pFVar2[lVar3].inPrivateClass.d.d = pDVar4;
      pFVar2[lVar3].inPrivateClass.d.ptr = (b->inPrivateClass).d.ptr;
      pFVar2[lVar3].inPrivateClass.d.size = (b->inPrivateClass).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar10 = b->isSlot;
      bVar11 = b->isSignal;
      bVar12 = b->isPrivateSignal;
      bVar13 = b->isConstructor;
      bVar14 = b->isDestructor;
      bVar15 = b->isAbstract;
      bVar16 = b->isRawSlot;
      pFVar6 = pFVar2 + lVar3;
      pFVar6->isScriptable = b->isScriptable;
      pFVar6->isSlot = bVar10;
      pFVar6->isSignal = bVar11;
      pFVar6->isPrivateSignal = bVar12;
      pFVar6->isConstructor = bVar13;
      pFVar6->isDestructor = bVar14;
      pFVar6->isAbstract = bVar15;
      pFVar6->isRawSlot = bVar16;
      iVar17 = b->revision;
      bVar10 = b->isConst;
      bVar11 = b->isVirtual;
      bVar12 = b->isStatic;
      bVar13 = b->inlineCode;
      bVar14 = b->wasCloned;
      bVar15 = b->returnTypeIsVolatile;
      bVar16 = b->isCompat;
      bVar18 = b->isInvokable;
      pFVar2[lVar3].access = b->access;
      pFVar2[lVar3].revision = iVar17;
      pFVar6 = pFVar2 + lVar3;
      pFVar6->isConst = bVar10;
      pFVar6->isVirtual = bVar11;
      pFVar6->isStatic = bVar12;
      pFVar6->inlineCode = bVar13;
      pFVar6->wasCloned = bVar14;
      pFVar6->returnTypeIsVolatile = bVar15;
      pFVar6->isCompat = bVar16;
      pFVar6->isInvokable = bVar18;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<FunctionDef>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }